

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

void __thiscall
mir::inst::LoadOffsetInst::LoadOffsetInst(LoadOffsetInst *this,Value *src,VarId *dest,Value *offset)

{
  Value *in_RCX;
  Value *in_RDX;
  Inst *in_RDI;
  VarId *dest_00;
  VarId local_30 [3];
  
  dest_00 = local_30;
  VarId::VarId((VarId *)in_RCX,(VarId *)in_RDX);
  Inst::Inst(in_RDI,dest_00);
  (in_RDI->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_00370280;
  Value::Value(in_RCX,in_RDX);
  Value::Value(in_RCX,in_RDX);
  return;
}

Assistant:

LoadOffsetInst(Value src, VarId dest, Value offset = 0)
      : src(src), Inst(dest), offset(offset) {}